

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LDSketch.cpp
# Opt level: O2

void LDSketch_update(LDSketch_t *sk,uchar *key,longlong val)

{
  uint uVar1;
  int row_no;
  
  for (row_no = 0; row_no < sk->h; row_no = row_no + 1) {
    uVar1 = LDSketch_find(sk,key,0,sk->lgn + -1,row_no);
    dyn_tbl_update(sk->tbl[(int)(sk->w * row_no + uVar1)],key,(int)val);
  }
  return;
}

Assistant:

void LDSketch_update(LDSketch_t* sk, unsigned char* key, long long val) {
	int j, k;

	// mangle
	// mangle(key, key_to_add, tbl->n/8);

	// add key/val to table
	for (j = 0; j < sk->h; ++j) {
		k = LDSketch_find(sk, key, 0, sk->lgn - 1, j);
		// tbl->T[j*tbl->w+k] += val;
		dyn_tbl_update(sk->tbl[j * sk->w + k], key, val);
	}
	// tbl->total += val;
}